

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded.cpp
# Opt level: O2

bool __thiscall clickhouse::CodedInputStream::ReadVarint64(CodedInputStream *this,uint64_t *value)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_RAX;
  undefined4 extraout_var;
  long lVar4;
  long lStack_38;
  uint8_t byte;
  
  *value = 0;
  lVar4 = 0;
  lStack_38 = in_RAX;
  while( true ) {
    lVar1 = lVar4 + 7;
    bVar2 = lVar1 != 0x4d;
    if (lVar1 == 0x4d) {
      return bVar2;
    }
    iVar3 = (*(this->input_->super_InputStream)._vptr_InputStream[2])(this->input_,&byte,1);
    if (CONCAT44(extraout_var,iVar3) != 1) break;
    *value = *value | (ulong)(byte & 0x7f) << ((byte)lVar4 & 0x3f);
    lVar4 = lVar1;
    if (-1 < lStack_38) {
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool CodedInputStream::ReadVarint64(uint64_t* value) {
    *value = 0;

    for (size_t i = 0; i < MAX_VARINT_BYTES; ++i) {
        uint8_t byte;

        if (!input_->ReadByte(&byte)) {
            return false;
        } else {
            *value |= uint64_t(byte & 0x7F) << (7 * i);

            if (!(byte & 0x80)) {
                return true;
            }
        }
    }

    // TODO skip invalid
    return false;
}